

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O3

void Gia_ManDupFadd(Gia_Man_t *pNew,Gia_Man_t *p,Vec_Int_t *vChain,Vec_Int_t *vFadds,Vec_Int_t *vMap
                   ,Vec_Wec_t *vChains,Vec_Int_t *vMap2Chain,Vec_Int_t *vTruths)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  uint *puVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  int pLits [3];
  
  if (0 < vChain->nSize) {
    lVar16 = 0;
    do {
      lVar12 = (long)(vChain->pArray[lVar16] * 5);
      lVar15 = 0;
      do {
        if (lVar16 == 0 || lVar15 != 0) {
          if ((lVar12 < 0) || (vFadds->nSize <= lVar12)) goto LAB_00675707;
          iVar10 = vFadds->pArray[lVar12];
          if (((long)iVar10 < 0) || (p->nObjs <= iVar10)) goto LAB_006756e8;
          Gia_ManDupWithFaddBoxes_rec
                    (pNew,p,p->pObjs + iVar10,vFadds,vMap,vChains,vMap2Chain,vTruths);
        }
        lVar12 = lVar12 + 1;
        lVar15 = lVar15 + -1;
      } while (lVar15 != -3);
      lVar16 = lVar16 + 1;
    } while (lVar16 < vChain->nSize);
    if (0 < vChain->nSize) {
      lVar16 = 0;
      uVar3 = 0;
      do {
        uVar7 = vChain->pArray[lVar16];
        if ((int)uVar7 < 0) goto LAB_00675707;
        uVar14 = uVar7 * 2;
        if ((vTruths->nSize <= (int)uVar14) || ((uint)vTruths->nSize <= (uVar14 | 1)))
        goto LAB_00675707;
        uVar11 = vTruths->pArray[uVar14];
        uVar14 = vTruths->pArray[uVar14 | 1];
        iVar13 = uVar7 * 5;
        iVar10 = vFadds->nSize;
        if (vFadds->nSize <= iVar13) {
          iVar10 = iVar13;
        }
        uVar8 = 0;
        do {
          if (iVar10 + uVar7 * -5 == uVar8) goto LAB_00675707;
          iVar1 = vFadds->pArray[(ulong)uVar7 * 5 + uVar8];
          if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_006756e8;
          if ((uVar8 != 0) || (uVar9 = uVar3, uVar3 == 0)) {
            uVar9 = p->pObjs[iVar1].Value;
          }
          pLits[uVar8] = uVar9;
          if ((int)uVar9 < 0) {
            __assert_fail("pLits[k] >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                          ,0x2d6,
                          "void Gia_ManDupFadd(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *)"
                         );
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != 3);
        if ((int)uVar14 < 0x8e) {
          if ((int)uVar14 < 0x4d) {
            if (uVar14 != 0x17) {
              if (uVar14 != 0x2b) {
LAB_0067581e:
                __assert_fail("iMajTruth == 0xE8 || iMajTruth == 0x17",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                              ,0x2e7,
                              "void Gia_ManDupFadd(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *)"
                             );
              }
              if (pLits[1] < 0) goto LAB_00675745;
              pLits[1] = pLits[1] ^ 1;
LAB_006753b3:
              uVar11 = uVar11 ^ 0xff;
LAB_006753ba:
              uVar14 = 0xe8;
              goto LAB_006753c4;
            }
          }
          else {
            if (uVar14 == 0x4d) {
              if (pLits[0] < 0) goto LAB_00675745;
              pLits[0] = pLits[0] ^ 1;
              goto LAB_006753b3;
            }
            if (uVar14 != 0x71) goto LAB_0067581e;
            uVar14 = 0x17;
LAB_006753c4:
            puVar6 = (uint *)(pLits + 2);
            uVar3 = pLits[2];
LAB_006753c9:
            if ((int)uVar3 < 0) {
LAB_00675745:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x131,"int Abc_LitNot(int)");
            }
            *puVar6 = uVar3 ^ 1;
            uVar11 = ~uVar11 & 0xff;
          }
LAB_006753dd:
          if (pLits[0] < 0) goto LAB_006757a2;
        }
        else {
          if ((int)uVar14 < 0xd4) {
            if (uVar14 == 0x8e) goto LAB_006753ba;
            if (uVar14 != 0xb2) goto LAB_0067581e;
            uVar14 = 0xe8;
            puVar6 = (uint *)(pLits + 1);
            uVar3 = pLits[1];
            goto LAB_006753c9;
          }
          if (uVar14 != 0xd4) {
            if (uVar14 != 0xe8) goto LAB_0067581e;
            goto LAB_006753dd;
          }
          if (pLits[0] < 0) goto LAB_00675745;
          pLits[0] = pLits[0] ^ 1;
          uVar11 = ~uVar11 & 0xff;
          uVar14 = 0xe8;
        }
        if ((pLits[0] & 1U) != 0) {
          lVar12 = 0;
          do {
            if (pLits[lVar12] < 0) goto LAB_00675745;
            pLits[lVar12] = pLits[lVar12] ^ 1;
            lVar12 = lVar12 + 1;
          } while (lVar12 != 3);
          if (pLits[0] < 0) {
LAB_006757a2:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x130,"int Abc_LitIsCompl(int)");
          }
          uVar11 = ~uVar11 & 0xff;
          uVar14 = ~uVar14 & 0xff;
        }
        if ((pLits[0] & 1U) != 0) {
          __assert_fail("!Abc_LitIsCompl(pLits[0])",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                        ,0x2f1,
                        "void Gia_ManDupFadd(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
        lVar12 = 0;
        do {
          Gia_ManAppendCo(pNew,pLits[lVar12]);
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        if ((uVar11 != 0x69) && (uVar11 != 0x96)) {
          __assert_fail("iXorTruth == 0x96 || iXorTruth == 0x69",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                        ,0x2f5,
                        "void Gia_ManDupFadd(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
        if (vFadds->nSize <= (int)(iVar13 + 3U)) goto LAB_00675707;
        iVar10 = vFadds->pArray[iVar13 + 3U];
        if (((long)iVar10 < 0) || (p->nObjs <= iVar10)) goto LAB_006756e8;
        pGVar2 = p->pObjs;
        pGVar4 = Gia_ManAppendObj(pNew);
        uVar8 = *(ulong *)pGVar4;
        *(ulong *)pGVar4 = uVar8 | 0x9fffffff;
        *(ulong *)pGVar4 =
             uVar8 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(pNew->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar5 = pNew->pObjs;
        if ((pGVar4 < pGVar5) || (pGVar5 + pNew->nObjs <= pGVar4)) {
LAB_00675764:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(pNew->vCis,(int)((ulong)((long)pGVar4 - (long)pGVar5) >> 2) * -0x55555555);
        pGVar5 = pNew->pObjs;
        if ((pGVar4 < pGVar5) || (pGVar5 + pNew->nObjs <= pGVar4)) goto LAB_00675764;
        uVar3 = (int)((ulong)((long)pGVar4 - (long)pGVar5) >> 2) * 0x55555556;
        if ((int)uVar3 < 0) {
LAB_00675783:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        pGVar2[iVar10].Value = uVar3 | uVar11 == 0x69;
        if ((uVar14 != 0x17) && (uVar14 != 0xe8)) {
          __assert_fail("iMajTruth == 0xE8 || iMajTruth == 0x17",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                        ,0x2f9,
                        "void Gia_ManDupFadd(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
        pGVar5 = Gia_ManAppendObj(pNew);
        uVar8 = *(ulong *)pGVar5;
        *(ulong *)pGVar5 = uVar8 | 0x9fffffff;
        *(ulong *)pGVar5 =
             uVar8 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(pNew->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar2 = pNew->pObjs;
        if ((pGVar5 < pGVar2) || (pGVar2 + pNew->nObjs <= pGVar5)) goto LAB_00675764;
        Vec_IntPush(pNew->vCis,(int)((ulong)((long)pGVar5 - (long)pGVar2) >> 2) * -0x55555555);
        pGVar2 = pNew->pObjs;
        if ((pGVar5 < pGVar2) || (pGVar2 + pNew->nObjs <= pGVar5)) goto LAB_00675764;
        uVar3 = (int)((ulong)((long)pGVar5 - (long)pGVar2) >> 2) * 0x55555556;
        if ((int)uVar3 < 0) goto LAB_00675783;
        uVar3 = uVar3 | uVar14 == 0x17;
        lVar16 = lVar16 + 1;
        iVar10 = vChain->nSize;
      } while (lVar16 < iVar10);
      if (0 < iVar10) {
        if (uVar7 != vChain->pArray[(long)iVar10 + -1]) {
          __assert_fail("iFadd == Vec_IntEntryLast(vChain)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                        ,0x2fd,
                        "void Gia_ManDupFadd(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
        uVar7 = uVar7 * 5 + 4;
        if ((int)uVar7 < vFadds->nSize) {
          iVar10 = vFadds->pArray[uVar7];
          if ((-1 < (long)iVar10) && (iVar10 < p->nObjs)) {
            p->pObjs[iVar10].Value = uVar3;
            return;
          }
LAB_006756e8:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
LAB_00675707:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
    }
  }
  __assert_fail("p->nSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
}

Assistant:

void Gia_ManDupFadd( Gia_Man_t * pNew, Gia_Man_t * p, Vec_Int_t * vChain, Vec_Int_t * vFadds, Vec_Int_t * vMap, Vec_Wec_t * vChains, Vec_Int_t * vMap2Chain, Vec_Int_t * vTruths )
{
    extern void Gia_ManDupWithFaddBoxes_rec( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vFadds, Vec_Int_t * vMap, Vec_Wec_t * vChains, Vec_Int_t * vMap2Chain, Vec_Int_t * vTruths );
    int i, k, iFadd = -1, iCiLit, pLits[3];
    Gia_Obj_t * pObj;
    // construct FADD inputs
    Vec_IntForEachEntry( vChain, iFadd, i )
        for ( k = 0; k < 3; k++ )
        {
            if ( i && !k ) continue;
            pObj = Gia_ManObj( p, Vec_IntEntry(vFadds, 5*iFadd+k) );
            Gia_ManDupWithFaddBoxes_rec( pNew, p, pObj, vFadds, vMap, vChains, vMap2Chain, vTruths );
        }
    // construct boxes
    iCiLit = 0;
    Vec_IntForEachEntry( vChain, iFadd, i )
    {
        int iXorTruth = Vec_IntEntry( vTruths, 2*iFadd+0 );
        int iMajTruth = Vec_IntEntry( vTruths, 2*iFadd+1 );
        for ( k = 0; k < 3; k++ )
        {
            pObj = Gia_ManObj( p, Vec_IntEntry(vFadds, 5*iFadd+k) );
            pLits[k] = (!k && iCiLit) ? iCiLit : pObj->Value;
            assert( pLits[k] >= 0 );
        }
        // normalize truth table
        //    if ( Truth == 0xE8 || Truth == 0xD4 || Truth == 0xB2 || Truth == 0x71 ||
        //         Truth == 0x17 || Truth == 0x2B || Truth == 0x4D || Truth == 0x8E )
        if ( iMajTruth == 0x4D )
            pLits[0] = Abc_LitNot(pLits[0]), iMajTruth = 0x8E, iXorTruth = 0xFF & ~iXorTruth;
        else if ( iMajTruth == 0xD4 )
            pLits[0] = Abc_LitNot(pLits[0]), iMajTruth = 0xE8, iXorTruth = 0xFF & ~iXorTruth;
        else if ( iMajTruth == 0x2B )
            pLits[1] = Abc_LitNot(pLits[1]), iMajTruth = 0x8E, iXorTruth = 0xFF & ~iXorTruth;
        else if ( iMajTruth == 0xB2 )
            pLits[1] = Abc_LitNot(pLits[1]), iMajTruth = 0xE8, iXorTruth = 0xFF & ~iXorTruth;
        if ( iMajTruth == 0x8E )
            pLits[2] = Abc_LitNot(pLits[2]), iMajTruth = 0xE8, iXorTruth = 0xFF & ~iXorTruth;
        else if ( iMajTruth == 0x71 )
            pLits[2] = Abc_LitNot(pLits[2]), iMajTruth = 0x17, iXorTruth = 0xFF & ~iXorTruth;
        else assert( iMajTruth == 0xE8 || iMajTruth == 0x17 );
        // normalize carry-in
        if ( Abc_LitIsCompl(pLits[0]) )
        {
            for ( k = 0; k < 3; k++ )
                pLits[k] = Abc_LitNot(pLits[k]);
            iXorTruth = 0xFF & ~iXorTruth;
            iMajTruth = 0xFF & ~iMajTruth;
        }
        // add COs
        assert( !Abc_LitIsCompl(pLits[0]) );
        for ( k = 0; k < 3; k++ )
            Gia_ManAppendCo( pNew, pLits[k] );
        // create CI
        assert( iXorTruth == 0x96 || iXorTruth == 0x69 );
        pObj = Gia_ManObj( p, Vec_IntEntry(vFadds, 5*iFadd+3) );
        pObj->Value = Abc_LitNotCond( Gia_ManAppendCi(pNew), (int)(iXorTruth == 0x69) );
        // create CI
        assert( iMajTruth == 0xE8 || iMajTruth == 0x17 );
        iCiLit = Abc_LitNotCond( Gia_ManAppendCi(pNew), (int)(iMajTruth == 0x17) );
    }   
    // assign carry out
    assert( iFadd == Vec_IntEntryLast(vChain) );
    pObj = Gia_ManObj( p, Vec_IntEntry(vFadds, 5*iFadd+4) );
    pObj->Value = iCiLit;
}